

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

vm_lookup_ext *
vm_lookup_ext::expand_ext(CVmObjLookupTable *self,vm_lookup_ext *old_ext,uint new_value_cnt)

{
  vm_lookup_ext *this;
  
  this = alloc_ext(self,old_ext->bucket_cnt,new_value_cnt);
  copy_ext_from(this,old_ext);
  (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])(G_mem_X->varheap_,old_ext);
  return this;
}

Assistant:

vm_lookup_ext *vm_lookup_ext::expand_ext(VMG_ CVmObjLookupTable *self,
                                         vm_lookup_ext *old_ext,
                                         uint new_value_cnt)
{
    vm_lookup_ext *new_ext;

    /* allocate a new extension structure of the requested size */
    new_ext = alloc_ext(vmg_ self, old_ext->bucket_cnt, new_value_cnt);

    /* copy the old extension data into the new extension */
    new_ext->copy_ext_from(old_ext);

    /* delete the old memory */
    G_mem->get_var_heap()->free_mem(old_ext);

    /* return the new extension */
    return new_ext;
}